

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

void fmt::v5::internal::
     value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
     ::format_custom_arg<std::chrono::duration<long,std::ratio<1l,1000000l>>>
               (void *arg,
               basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
               *ctx)

{
  size_t *psVar1;
  char *pcVar2;
  iterator pcVar3;
  iterator iVar4;
  type f;
  formatter<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_char,_void> local_50;
  
  local_50.spec.width_ = 0;
  local_50.spec.fill_ = L' ';
  local_50.spec.align_ = ALIGN_DEFAULT;
  local_50.width_ref.kind = NONE;
  local_50.width_ref.field_1.index = 0;
  local_50.format_str.data_ = (char *)0x0;
  local_50.format_str.size_ = 0;
  pcVar3 = formatter<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_char,_void>::parse
                     (&local_50,(basic_parse_context<char,_fmt::v5::internal::error_handler> *)ctx);
  pcVar2 = (ctx->
           super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
           ).parse_context_.format_str_.data_;
  (ctx->
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
  ).parse_context_.format_str_.data_ = pcVar3;
  psVar1 = &(ctx->
            super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
            ).parse_context_.format_str_.size_;
  *psVar1 = (size_t)(pcVar2 + (*psVar1 - (long)pcVar3));
  iVar4 = formatter<std::chrono::duration<long,std::ratio<1l,1000000l>>,char,void>::
          format<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                    ((formatter<std::chrono::duration<long,std::ratio<1l,1000000l>>,char,void> *)
                     &local_50,(duration *)arg,ctx);
  (ctx->
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
  ).out_.container = iVar4.container;
  return;
}

Assistant:

static void format_custom_arg(const void *arg, Context &ctx) {
    // Get the formatter type through the context to allow different contexts
    // have different extension points, e.g. `formatter<T>` for `format` and
    // `printf_formatter<T>` for `printf`.
    typename Context::template formatter_type<T>::type f;
    auto &&parse_ctx = ctx.parse_context();
    parse_ctx.advance_to(f.parse(parse_ctx));
    ctx.advance_to(f.format(*static_cast<const T*>(arg), ctx));
  }